

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O3

void testing::internal::PrintCharAndCodeTo<wchar_t>(wchar_t c,ostream *os)

{
  undefined4 uVar1;
  long lVar2;
  bool bVar3;
  uint32_t value;
  long lVar4;
  char *pcVar5;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"L",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  switch(c) {
  case L'\0':
    std::__ostream_insert<char,std::char_traits<char>>(os,"\\0",2);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
    return;
  case L'\x01':
  case L'\x02':
  case L'\x03':
  case L'\x04':
  case L'\x05':
  case L'\x06':
switchD_001a7fd2_caseD_1:
    if (0x5e < (uint)(c + L'\xffffffe0')) {
      uVar1 = *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\\x",2);
      lVar4 = *(long *)os;
      lVar2 = *(long *)(lVar4 + -0x18);
      *(uint *)(os + lVar2 + 0x18) = *(uint *)(os + lVar2 + 0x18) & 0xffffffb5 | 8;
      *(uint *)(os + *(long *)(lVar4 + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(lVar4 + -0x18) + 0x18) | 0x4000;
      std::ostream::operator<<((ostream *)os,c);
      *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = uVar1;
      std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
      bVar3 = true;
      if (c == L'\0') {
        return;
      }
      goto LAB_001a80a0;
    }
    pcVar5 = (char *)&local_40;
    local_40._M_dataplus._M_p._0_1_ = (undefined1)c;
    lVar4 = 1;
    goto LAB_001a8082;
  case L'\a':
    pcVar5 = "\\a";
    break;
  case L'\b':
    pcVar5 = "\\b";
    break;
  case L'\t':
    pcVar5 = "\\t";
    break;
  case L'\n':
    pcVar5 = "\\n";
    break;
  case L'\v':
    pcVar5 = "\\v";
    break;
  case L'\f':
    pcVar5 = "\\f";
    break;
  case L'\r':
    pcVar5 = "\\r";
    break;
  default:
    if (c == L'\'') {
      pcVar5 = "\\\'";
    }
    else {
      if (c != L'\\') goto switchD_001a7fd2_caseD_1;
      pcVar5 = "\\\\";
    }
  }
  lVar4 = 2;
LAB_001a8082:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  bVar3 = false;
LAB_001a80a0:
  std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
  std::ostream::operator<<((ostream *)os,c);
  if (9 < (uint)c && !bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(os,", 0x",4);
    String::FormatHexUInt32_abi_cxx11_(&local_40,(String *)(ulong)(uint)c,value);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_),
               local_40._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_),
                      local_40.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << GetCharWidthPrefix(c) << "'";
  const CharFormat format = PrintAsCharLiteralTo(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0) return;
  *os << " (" << static_cast<int>(c);

  // For more convenience, we print c's code again in hexadecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << ", 0x" << String::FormatHexInt(static_cast<int>(c));
  }
  *os << ")";
}